

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_cert(ptls_verify_certificate_t *_self,ptls_t *tls,char *server_name,
               _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
               ptls_iovec_t *certs,size_t num_certs)

{
  X509_STORE *store;
  ptls_iovec_t vec;
  size_t chain_00;
  stack_st_X509 *cert_00;
  int is_server;
  X509 *pXVar1;
  EVP_PKEY *pEVar2;
  OPENSSL_STACK *pOVar3;
  OPENSSL_sk_freefunc p_Var4;
  X509 *interm;
  int ret;
  int ossl_x509_err;
  size_t i;
  stack_st_X509 *chain;
  X509 *cert;
  ptls_openssl_verify_certificate_t *self;
  ptls_iovec_t *certs_local;
  void **verify_data_local;
  _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier_local;
  char *server_name_local;
  ptls_t *tls_local;
  ptls_verify_certificate_t *_self_local;
  
  chain = (stack_st_X509 *)0x0;
  cert = (X509 *)_self;
  self = (ptls_openssl_verify_certificate_t *)certs;
  certs_local = (ptls_iovec_t *)verify_data;
  verify_data_local = verifier;
  verifier_local = (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **)server_name;
  server_name_local = (char *)tls;
  tls_local = (ptls_t *)_self;
  i = OPENSSL_sk_new_null();
  if (num_certs == 0) {
    interm._0_4_ = 0x74;
    interm._4_4_ = 0;
  }
  else {
    vec.base = (uint8_t *)(self->super).cb;
    vec.len = (size_t)(self->super).algos;
    chain = (stack_st_X509 *)to_x509(vec);
    if (chain == (stack_st_X509 *)0x0) {
      interm._0_4_ = 0x2a;
      goto LAB_0013bd29;
    }
    for (_ret = 1; cert_00 = chain, chain_00 = i, _ret != num_certs; _ret = _ret + 1) {
      pXVar1 = to_x509(*(ptls_iovec_t *)(&self->super + _ret));
      if (pXVar1 == (X509 *)0x0) {
        interm._0_4_ = 0x2a;
        goto LAB_0013bd29;
      }
      pOVar3 = ossl_check_X509_sk_type((stack_st_X509 *)i);
      pXVar1 = ossl_check_X509_type(pXVar1);
      OPENSSL_sk_push(pOVar3,pXVar1);
    }
    store = *(X509_STORE **)(cert + 0x10);
    is_server = ptls_is_server((ptls_t *)server_name_local);
    interm._0_4_ = verify_cert_chain(store,(X509 *)cert_00,(stack_st_X509 *)chain_00,is_server,
                                     (char *)verifier_local,(int *)((long)&interm + 4));
  }
  if (*(long *)(cert + 0x18) != 0) {
    interm._0_4_ = (*(code *)**(undefined8 **)(cert + 0x18))
                             (*(undefined8 *)(cert + 0x18),server_name_local,(int)interm,
                              interm._4_4_,chain,i);
  }
  if (((int)interm == 0) && (num_certs != 0)) {
    pEVar2 = X509_get_pubkey((X509 *)chain);
    certs_local->base = (uint8_t *)pEVar2;
    if (pEVar2 == (EVP_PKEY *)0x0) {
      interm._0_4_ = 0x2a;
    }
    else {
      *verify_data_local = verify_sign;
    }
  }
LAB_0013bd29:
  if (i != 0) {
    pOVar3 = ossl_check_X509_sk_type((stack_st_X509 *)i);
    p_Var4 = ossl_check_X509_freefunc_type(X509_free);
    OPENSSL_sk_pop_free(pOVar3,p_Var4);
  }
  if (chain != (stack_st_X509 *)0x0) {
    X509_free((X509 *)chain);
  }
  return (int)interm;
}

Assistant:

static int verify_cert(ptls_verify_certificate_t *_self, ptls_t *tls, const char *server_name,
                       int (**verifier)(void *, uint16_t, ptls_iovec_t, ptls_iovec_t), void **verify_data, ptls_iovec_t *certs,
                       size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = sk_X509_new_null();
    size_t i;
    int ossl_x509_err, ret;

    /* If any certs are given, convert them to OpenSSL representation, then verify the cert chain. If no certs are given, just give
     * the override_callback to see if we want to stay fail open. */
    if (num_certs != 0) {
        if ((cert = to_x509(certs[0])) == NULL) {
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            goto Exit;
        }
        for (i = 1; i != num_certs; ++i) {
            X509 *interm = to_x509(certs[i]);
            if (interm == NULL) {
                ret = PTLS_ALERT_BAD_CERTIFICATE;
                goto Exit;
            }
            sk_X509_push(chain, interm);
        }
        ret = verify_cert_chain(self->cert_store, cert, chain, ptls_is_server(tls), server_name, &ossl_x509_err);
    } else {
        ret = PTLS_ALERT_CERTIFICATE_REQUIRED;
        ossl_x509_err = 0;
    }

    /* When override callback is available, let it override the error. */
    if (self->override_callback != NULL)
        ret = self->override_callback->cb(self->override_callback, tls, ret, ossl_x509_err, cert, chain);

    if (ret != 0 || num_certs == 0)
        goto Exit;

    /* extract public key for verifying the TLS handshake signature */
    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (chain != NULL)
        sk_X509_pop_free(chain, X509_free);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}